

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

ParsedNumber<unsigned_long_long> * __thiscall
QtPrivate::toUnsignedInteger
          (ParsedNumber<unsigned_long_long> *__return_storage_ptr__,QtPrivate *this,
          QByteArrayView data,int base)

{
  uint uVar1;
  unsigned_long_long uVar2;
  QSimpleParsedNumber<unsigned_long_long> QVar3;
  QByteArrayView num;
  
  if (this == (QtPrivate *)0x0) {
    uVar1 = 1;
    uVar2 = 0;
  }
  else {
    num.m_data._4_4_ = 0;
    num._0_12_ = data._0_12_;
    QVar3 = QLocaleData::bytearrayToUnsLongLong((QLocaleData *)this,num,(int)data.m_data);
    uVar1 = (uint)(QVar3.used < 1);
    uVar2 = 0;
    if (0 < QVar3.used) {
      uVar2 = QVar3.result;
    }
  }
  __return_storage_ptr__->m_value = uVar2;
  *(uint *)&__return_storage_ptr__->field_0x8 = uVar1;
  __return_storage_ptr__->m_reserved2 = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto QtPrivate::toUnsignedInteger(QByteArrayView data, int base) -> ParsedNumber<qulonglong>
{
#if defined(QT_CHECK_RANGE)
    if (base != 0 && (base < 2 || base > 36)) {
        qWarning("QByteArray::toIntegral: Invalid base %d", base);
        base = 10;
    }
#endif
    if (data.isEmpty())
        return {};

    const QSimpleParsedNumber r = QLocaleData::bytearrayToUnsLongLong(data, base);
    if (r.ok())
        return ParsedNumber(r.result);
    return {};
}